

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O2

void __thiscall HTTPRequestTracker::RemoveRequest(HTTPRequestTracker *this,evhttp_request *req)

{
  evhttp_request **ppeVar1;
  evhttp_connection **ppeVar2;
  iterator it;
  long lVar3;
  long in_FS_OFFSET;
  evhttp_connection *conn;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock10;
  evhttp_connection *local_40;
  evhttp_request *local_38;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = req;
  ppeVar1 = inline_assertion_check<true,evhttp_request*&>
                      (&local_38,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp"
                       ,0xb7,"RemoveRequest","req");
  local_30._M_device = (mutex_type *)evhttp_request_get_connection(*ppeVar1);
  ppeVar2 = inline_assertion_check<true,evhttp_connection*>
                      ((evhttp_connection **)&local_30,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp"
                       ,0xb7,"RemoveRequest","evhttp_request_get_connection(Assert(req))");
  local_40 = *ppeVar2;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_30,&this->m_mutex,"m_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp"
             ,0xb8,false);
  it = std::
       _Hashtable<const_evhttp_connection_*,_std::pair<const_evhttp_connection_*const,_unsigned_long>,_std::allocator<std::pair<const_evhttp_connection_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_evhttp_connection_*>,_std::hash<const_evhttp_connection_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       ::find(&(this->m_tracker)._M_h,&local_40);
  if (((it.
        super__Node_iterator_base<std::pair<const_evhttp_connection_*const,_unsigned_long>,_false>.
        _M_cur != (__node_type *)0x0) &&
      (*(long *)((long)it.
                       super__Node_iterator_base<std::pair<const_evhttp_connection_*const,_unsigned_long>,_false>
                       ._M_cur + 0x10) != 0)) &&
     (lVar3 = *(long *)((long)it.
                              super__Node_iterator_base<std::pair<const_evhttp_connection_*const,_unsigned_long>,_false>
                              ._M_cur + 0x10) + -1,
     *(long *)((long)it.
                     super__Node_iterator_base<std::pair<const_evhttp_connection_*const,_unsigned_long>,_false>
                     ._M_cur + 0x10) = lVar3, lVar3 == 0)) {
    RemoveConnectionInternal
              (this,(iterator)
                    it.
                    super__Node_iterator_base<std::pair<const_evhttp_connection_*const,_unsigned_long>,_false>
                    ._M_cur);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        const evhttp_connection* conn{Assert(evhttp_request_get_connection(Assert(req)))};
        LOCK(m_mutex);
        auto it{m_tracker.find(conn)};
        if (it != m_tracker.end() && it->second > 0) {
            if (--(it->second) == 0) RemoveConnectionInternal(it);
        }
    }